

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error asmjit::CodeHolder_reserveInternal(CodeHolder *self,CodeBuffer *cb,size_t n)

{
  long lVar1;
  long lVar2;
  size_t in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  size_t offset;
  Assembler *a;
  uint8_t *newData;
  uint8_t *oldData;
  void *local_58;
  Error local_30;
  
  if (((void *)*in_RSI == (void *)0x0) || ((*(byte *)(in_RSI + 3) & 1) != 0)) {
    local_58 = malloc(in_RDX);
  }
  else {
    local_58 = realloc((void *)*in_RSI,in_RDX);
  }
  if (local_58 == (void *)0x0) {
    local_30 = 1;
  }
  else {
    *in_RSI = local_58;
    in_RSI[2] = in_RDX;
    lVar1 = *(long *)(in_RDI + 0x20);
    if ((lVar1 != 0) && ((undefined8 *)(*(long *)(lVar1 + 0x78) + 0x38) == in_RSI)) {
      lVar2 = *(long *)(lVar1 + 0x80);
      *(void **)(lVar1 + 0x80) = local_58;
      *(size_t *)(lVar1 + 0x88) = (long)local_58 + in_RDX;
      *(long *)(lVar1 + 0x90) = (long)local_58 + (*(long *)(lVar1 + 0x90) - lVar2);
    }
    local_30 = 0;
  }
  return local_30;
}

Assistant:

static Error CodeHolder_reserveInternal(CodeHolder* self, CodeBuffer* cb, size_t n) noexcept {
  uint8_t* oldData = cb->_data;
  uint8_t* newData;

  if (oldData && !cb->isExternal())
    newData = static_cast<uint8_t*>(Internal::reallocMemory(oldData, n));
  else
    newData = static_cast<uint8_t*>(Internal::allocMemory(n));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorNoHeapMemory);

  cb->_data = newData;
  cb->_capacity = n;

  // Update the `Assembler` pointers if attached. Maybe we should introduce an
  // event for this, but since only one Assembler can be attached at a time it
  // should not matter how these pointers are updated.
  Assembler* a = self->_cgAsm;
  if (a && &a->_section->_buffer == cb) {
    size_t offset = a->getOffset();

    a->_bufferData = newData;
    a->_bufferEnd  = newData + n;
    a->_bufferPtr  = newData + offset;
  }

  return kErrorOk;
}